

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O3

bool __thiscall CSocekt::Initialize_subproc(CSocekt *this)

{
  vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *this_00;
  pointer *pppTVar1;
  iterator iVar2;
  int iVar3;
  SourceFile file;
  SourceFile file_00;
  ThreadItem *pTimemonitor;
  ThreadItem *pRecyconn;
  ThreadItem *pSendQueue;
  ThreadItem *local_1008;
  ThreadItem *local_1000;
  ThreadItem *local_ff8;
  Logger local_ff0;
  
  iVar3 = sem_init((sem_t *)&this->m_semEventSendQueue,0,0);
  if (iVar3 == -1) {
    if (2 < muduo::g_logLevel) {
      return false;
    }
    file._8_8_ = 0xe;
    file.data_ = "flyd_socket.cc";
    muduo::Logger::Logger(&local_ff0,file,0x6a);
    if (0x41 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
      memcpy(local_ff0.impl_.stream_.buffer_.cur_,anon_var_dwarf_1b536,0x41);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x41;
    }
  }
  else {
    this_00 = &this->m_threadVector;
    local_ff8 = (ThreadItem *)operator_new(0x18);
    local_ff8->_pThis = this;
    local_ff8->ifrunning = false;
    iVar2._M_current =
         (this->m_threadVector).
         super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_threadVector).
        super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CSocekt::ThreadItem*,std::allocator<CSocekt::ThreadItem*>>::
      _M_realloc_insert<CSocekt::ThreadItem*const&>
                ((vector<CSocekt::ThreadItem*,std::allocator<CSocekt::ThreadItem*>> *)this_00,iVar2,
                 &local_ff8);
    }
    else {
      *iVar2._M_current = local_ff8;
      pppTVar1 = &(this->m_threadVector).
                  super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    iVar3 = pthread_create(&local_ff8->_Handle,(pthread_attr_t *)0x0,ServerSendQueueThread,local_ff8
                          );
    if (iVar3 != 0) {
      return false;
    }
    local_1000 = (ThreadItem *)operator_new(0x18);
    local_1000->_pThis = this;
    local_1000->ifrunning = false;
    iVar2._M_current =
         (this->m_threadVector).
         super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_threadVector).
        super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CSocekt::ThreadItem*,std::allocator<CSocekt::ThreadItem*>>::
      _M_realloc_insert<CSocekt::ThreadItem*const&>
                ((vector<CSocekt::ThreadItem*,std::allocator<CSocekt::ThreadItem*>> *)this_00,iVar2,
                 &local_1000);
    }
    else {
      *iVar2._M_current = local_1000;
      pppTVar1 = &(this->m_threadVector).
                  super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    iVar3 = pthread_create(&local_1000->_Handle,(pthread_attr_t *)0x0,ServerRecyConnectionThread,
                           local_1000);
    if (iVar3 != 0) {
      return false;
    }
    if (this->m_ifkickTimeCount != 1) {
      return true;
    }
    local_1008 = (ThreadItem *)operator_new(0x18);
    local_1008->_pThis = this;
    local_1008->ifrunning = false;
    iVar2._M_current =
         (this->m_threadVector).
         super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_threadVector).
        super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CSocekt::ThreadItem*,std::allocator<CSocekt::ThreadItem*>>::
      _M_realloc_insert<CSocekt::ThreadItem*const&>
                ((vector<CSocekt::ThreadItem*,std::allocator<CSocekt::ThreadItem*>> *)this_00,iVar2,
                 &local_1008);
    }
    else {
      *iVar2._M_current = local_1008;
      pppTVar1 = &(this->m_threadVector).
                  super__Vector_base<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    iVar3 = pthread_create(&local_1008->_Handle,(pthread_attr_t *)0x0,ServerTimerQueueMonitorThread,
                           local_1008);
    if (iVar3 == 0) {
      return true;
    }
    file_00._8_8_ = 0xe;
    file_00.data_ = "flyd_socket.cc";
    muduo::Logger::Logger(&local_ff0,file_00,0x88,ERROR);
    if (0x54 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
      memcpy(local_ff0.impl_.stream_.buffer_.cur_,anon_var_dwarf_1b54c,0x54);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x54;
    }
  }
  muduo::Logger::~Logger(&local_ff0);
  return false;
}

Assistant:

bool CSocekt::Initialize_subproc()
{
     //互斥量的初始化已经写成互斥类MutexLock的构造函数里面了
   
    //初始化发消息相关信号量，信号量用于进程/线程 之间的同步，虽然 互斥量[pthread_mutex_lock]和 条件变量[pthread_cond_wait]都是线程之间的同步手段，但
    //这里用信号量实现 则 更容易理解，更容易简化问题，使用书写的代码短小且清晰；
    //第二个参数=0，表示信号量在线程之间共享，确实如此 ，如果非0，表示在进程之间共享
    //第三个参数=0，表示信号量的初始值，为0时，调用sem_wait()就会卡在那里卡着
    if(sem_init(&m_semEventSendQueue,0,0) == -1)
    {
        //ngx_log_stderr(0,"CSocekt::Initialize()中sem_init(&m_semEventSendQueue,0,0)失败.");
        LOG_INFO << "CSocekt::Initialize()中sem_init(&m_semEventSendQueue,0,0)失败.";
        return false;
    }

    //创建线程
    int err;
    ThreadItem *pSendQueue;    //专门用来发送数据的线程
    m_threadVector.push_back(pSendQueue = new ThreadItem(this));                         //创建 一个新线程对象 并入到容器中 
    err = pthread_create(&pSendQueue->_Handle, NULL, ServerSendQueueThread,pSendQueue); //创建线程，错误不返回到errno，一般返回错误码
    if(err != 0)
    {
        return false;
    }

    //---
    ThreadItem *pRecyconn;    //专门用来回收连接的线程
    m_threadVector.push_back(pRecyconn = new ThreadItem(this)); 
    err = pthread_create(&pRecyconn->_Handle, NULL, ServerRecyConnectionThread,pRecyconn);
    if(err != 0)
    {
        return false;
    }

    if(m_ifkickTimeCount == 1)  //是否开启踢人时钟，1：开启   0：不开启
    {
        ThreadItem *pTimemonitor;    //专门用来处理到期不发心跳包的用户踢出的线程
        m_threadVector.push_back(pTimemonitor = new ThreadItem(this)); 
        err = pthread_create(&pTimemonitor->_Handle, NULL, ServerTimerQueueMonitorThread,pTimemonitor);
        if(err != 0)
        {
            LOG_ERROR << "CSocekt::Initialize_subproc()中pthread_create(ServerTimerQueueMonitorThread)失败.";
            return false;
        }
    }

    return true;
}